

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkUtil.c
# Opt level: O2

void Nwk_ManRemoveDupFaninsNode(Nwk_Obj_t *pObj,int iFan0,int iFan1,Vec_Int_t *vTruth)

{
  Hop_Man_t *p;
  Hop_Obj_t *pFunc;
  Hop_Obj_t *pHVar1;
  
  if (pObj->pFanio[iFan0] == pObj->pFanio[iFan1]) {
    pHVar1 = pObj->pFunc;
    p = pObj->pMan->pManHop;
    pFunc = Hop_IthVar(p,iFan0);
    pHVar1 = Hop_Compose(p,pHVar1,pFunc,iFan1);
    pObj->pFunc = pHVar1;
    Nwk_ManMinimumBaseNode(pObj,vTruth,0);
    return;
  }
  __assert_fail("pObj->pFanio[iFan0] == pObj->pFanio[iFan1]",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkUtil.c"
                ,0x250,"void Nwk_ManRemoveDupFaninsNode(Nwk_Obj_t *, int, int, Vec_Int_t *)");
}

Assistant:

void Nwk_ManRemoveDupFaninsNode( Nwk_Obj_t * pObj, int iFan0, int iFan1, Vec_Int_t * vTruth )
{
    Hop_Man_t * pManHop = pObj->pMan->pManHop;
//    Nwk_Obj_t * pFanin0 = pObj->pFanio[iFan0];
//    Nwk_Obj_t * pFanin1 = pObj->pFanio[iFan1];
    assert( pObj->pFanio[iFan0] == pObj->pFanio[iFan1] );
    pObj->pFunc = Hop_Compose( pManHop, pObj->pFunc, Hop_IthVar(pManHop,iFan0), iFan1 );
    Nwk_ManMinimumBaseNode( pObj, vTruth, 0 );
}